

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O2

ChMatrix33<double> * __thiscall
chrono::fea::ChElementBeamANCF_3243::GetGreenLagrangeStrain
          (ChMatrix33<double> *__return_storage_ptr__,ChElementBeamANCF_3243 *this,double xi,
          double eta,double zeta)

{
  ChMatrix33<double> I3x3;
  ChMatrixNMc<double,_3,_3> F;
  ChMatrix33<double> J_0xi;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  double local_340;
  NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *local_338;
  NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *local_330;
  DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_Eigen::Matrix<double,_8,_3,_0,_8,_3>,_0>_>
  *local_328;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
  local_318;
  Product<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
  *local_2d8;
  Matrix<double,_8,_3,_0,_8,_3> *local_2d0;
  Matrix<double,_3,_3,_1,_3,_3> *local_290 [9];
  Matrix<double,_3,_3,_1,_3,_3> local_248;
  Product<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
  local_200 [12];
  Matrix<double,_8,_3,_0,_8,_3> local_140;
  
  Calc_Sxi_D(this,&local_140,xi,eta,zeta);
  local_200[0].m_lhs = (LhsNested)&this->m_ebar0;
  local_290[0] = &local_248;
  local_200[0].m_rhs.m_xpr = (XprTypeNested)&local_140;
  Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_290,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_Eigen::Matrix<double,_8,_3,_0,_8,_3>,_0>_>
              *)local_200);
  local_200[0].m_lhs = &local_140;
  local_200[0].m_rhs.m_xpr = &local_248;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,8,3,0,8,3>,Eigen::Product<Eigen::Matrix<double,8,3,0,8,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>,0>>
            (&local_140,local_200);
  CalcCoordMatrix(this,(Matrix3xN *)local_200);
  local_2d8 = local_200;
  local_2d0 = &local_140;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,8,1,3,8>,Eigen::Matrix<double,8,3,0,8,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_290,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_Eigen::Matrix<double,_8,_3,_0,_8,_3>,_0>_>
              *)&local_2d8);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_false>::run
            ((Matrix<double,_3,_3,_1,_3,_3> *)&local_2d8);
  local_340 = 0.5;
  local_338 = (NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_290;
  local_330 = (NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_290;
  local_328 = (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_Eigen::Matrix<double,_8,_3,_0,_8,_3>,_0>_>
               *)&local_2d8;
  Eigen::operator*(&local_318,&local_340,(StorageBaseType *)&local_338);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
              *)&local_318);
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> ChElementBeamANCF_3243::GetGreenLagrangeStrain(const double xi, const double eta, const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    ChMatrix33<> I3x3;
    I3x3.setIdentity();
    return 0.5 * (F.transpose() * F - I3x3);
}